

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TasmanianSparseGrid.cpp
# Opt level: O0

void __thiscall
TasGrid::TasmanianSparseGrid::getInterpolationWeights
          (TasmanianSparseGrid *this,vector<double,_std::allocator<double>_> *x,
          vector<double,_std::allocator<double>_> *weights)

{
  int iVar1;
  size_type sVar2;
  pointer this_00;
  runtime_error *this_01;
  double *x_00;
  double *weights_00;
  vector<double,_std::allocator<double>_> *weights_local;
  vector<double,_std::allocator<double>_> *x_local;
  TasmanianSparseGrid *this_local;
  
  sVar2 = ::std::vector<double,_std::allocator<double>_>::size(x);
  this_00 = ::std::
            unique_ptr<TasGrid::BaseCanonicalGrid,_std::default_delete<TasGrid::BaseCanonicalGrid>_>
            ::operator->(&this->base);
  iVar1 = BaseCanonicalGrid::getNumDimensions(this_00);
  if (sVar2 != (long)iVar1) {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::runtime_error::runtime_error
              (this_01,
               "ERROR: getInterpolationWeights() incorrect size of x, must be same as getNumDimensions()"
              );
    __cxa_throw(this_01,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
  }
  iVar1 = getNumPoints(this);
  ::std::vector<double,_std::allocator<double>_>::resize(weights,(long)iVar1);
  x_00 = ::std::vector<double,_std::allocator<double>_>::data(x);
  weights_00 = ::std::vector<double,_std::allocator<double>_>::data(weights);
  getInterpolationWeights(this,x_00,weights_00);
  return;
}

Assistant:

void TasmanianSparseGrid::getInterpolationWeights(const std::vector<double> &x, std::vector<double> &weights) const{
    if (x.size() != (size_t) base->getNumDimensions()) throw std::runtime_error("ERROR: getInterpolationWeights() incorrect size of x, must be same as getNumDimensions()");
    weights.resize((size_t) getNumPoints());
    getInterpolationWeights(x.data(), weights.data());
}